

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O1

ModuleDeclaration * __thiscall
soul::SourceCodeOperations::createDecl
          (ModuleDeclaration *__return_storage_ptr__,SourceCodeOperations *this,ModuleBase *m)

{
  byte bVar1;
  SourceCodeText *pSVar2;
  SourceCodeText *o;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  UnicodeChar UVar5;
  byte unaff_BPL;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  UTF8Reader t;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  UTF8Reader local_b0;
  UTF8Reader local_a8;
  Ptr local_a0;
  UTF8Reader local_98;
  _Alloc_hider local_90;
  undefined1 local_88 [16];
  CodeLocation local_78;
  CodeLocation local_68;
  CodeLocation local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __return_storage_ptr__->module = m;
  __return_storage_ptr__->allocator = &this->allocator;
  (__return_storage_ptr__->startIncludingPreamble).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->startIncludingPreamble).location.data = (char *)0x0;
  (__return_storage_ptr__->moduleKeyword).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->moduleKeyword).location.data = (char *)0x0;
  (__return_storage_ptr__->openBrace).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->openBrace).location.data = (char *)0x0;
  (__return_storage_ptr__->endOfClosingBrace).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->endOfClosingBrace).location.data = (char *)0x0;
  (__return_storage_ptr__->fileComment).valid = false;
  (__return_storage_ptr__->fileComment).isStarSlash = false;
  (__return_storage_ptr__->fileComment).isDoxygenStyle = false;
  (__return_storage_ptr__->fileComment).isReferringBackwards = false;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->fileComment).range.start.sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->fileComment).range.start.location.data = (char *)0x0;
  (__return_storage_ptr__->fileComment).range.end.sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->fileComment).range.end.location.data = (char *)0x0;
  pSVar2 = (m->processorKeywordLocation).sourceCode.object;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  o = (__return_storage_ptr__->moduleKeyword).sourceCode.object;
  (__return_storage_ptr__->moduleKeyword).sourceCode.object = pSVar2;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  (__return_storage_ptr__->moduleKeyword).location.data =
       (m->processorKeywordLocation).location.data;
  ModuleDeclaration::getType_abi_cxx11_((string *)local_d0,__return_storage_ptr__);
  uVar3 = local_d0._0_8_;
  local_90._M_p = (pointer)&__return_storage_ptr__->startIncludingPreamble;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(__return_storage_ptr__->moduleKeyword).location.data;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_d0._0_8_;
  do {
    bVar1 = paVar6->_M_local_buf[0];
    if (bVar1 == 0) {
      bVar7 = false;
      unaff_BPL = 1;
    }
    else {
      UVar5 = UTF8Reader::getAndAdvance((UTF8Reader *)&local_48);
      bVar7 = UVar5 == bVar1;
      unaff_BPL = unaff_BPL & bVar7;
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar6 + 1);
  } while (bVar7);
  if (unaff_BPL != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar3 != &local_c0) {
      operator_delete((void *)uVar3,(ulong)(local_c0._M_allocated_capacity + 1));
    }
    local_58.sourceCode.object = (__return_storage_ptr__->moduleKeyword).sourceCode.object;
    if (local_58.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_58.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_58.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_58.location.data = (__return_storage_ptr__->moduleKeyword).location.data;
    SourceCodeUtilities::findStartOfPrecedingComment((SourceCodeUtilities *)local_d0,&local_58);
    _Var4._M_p = local_90._M_p;
    paVar6 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_90._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ != paVar6) {
      *(undefined8 *)local_90._M_p = local_d0._0_8_;
      local_d0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)paVar6);
    }
    (__return_storage_ptr__->startIncludingPreamble).location.data = (char *)local_d0._8_8_;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_d0._0_8_);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.sourceCode.object);
    local_68.sourceCode.object = (__return_storage_ptr__->moduleKeyword).sourceCode.object;
    if (local_68.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_68.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_68.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_68.location.data = (__return_storage_ptr__->moduleKeyword).location.data;
    SimpleTokeniser::findNext((SimpleTokeniser *)local_d0,&local_68,(TokenType)0x289d4b);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(__return_storage_ptr__->openBrace).sourceCode.object;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ != paVar6) {
      (__return_storage_ptr__->openBrace).sourceCode.object = (SourceCodeText *)local_d0._0_8_;
      local_d0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)paVar6);
    }
    (__return_storage_ptr__->openBrace).location.data = (char *)local_d0._8_8_;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_d0._0_8_);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.sourceCode.object);
    local_78.sourceCode.object = (__return_storage_ptr__->openBrace).sourceCode.object;
    if (local_78.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_78.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_78.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_78.location.data = (__return_storage_ptr__->openBrace).location.data;
    SimpleTokeniser::findEndOfMatchingDelimiter
              ((SimpleTokeniser *)local_d0,&local_78,(TokenType)0x289d4b,(TokenType)0x2886a0);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(__return_storage_ptr__->endOfClosingBrace).sourceCode.object;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ != paVar6) {
      (__return_storage_ptr__->endOfClosingBrace).sourceCode.object =
           (SourceCodeText *)local_d0._0_8_;
      local_d0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)paVar6);
    }
    (__return_storage_ptr__->endOfClosingBrace).location.data = (char *)local_d0._8_8_;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_d0._0_8_);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_78.sourceCode.object);
    local_88._0_8_ = *(undefined8 *)_Var4._M_p;
    if ((SourceCodeText *)local_88._0_8_ != (SourceCodeText *)0x0) {
      (((SourceCodeText *)local_88._0_8_)->super_RefCountedObject).refCount =
           (((SourceCodeText *)local_88._0_8_)->super_RefCountedObject).refCount + 1;
    }
    local_88._8_8_ = (__return_storage_ptr__->startIncludingPreamble).location.data;
    SourceCodeUtilities::parseComment((Comment *)local_d0,(CodeLocation *)local_88);
    uVar3 = local_d0._0_8_;
    (__return_storage_ptr__->fileComment).valid = (bool)local_d0[0];
    (__return_storage_ptr__->fileComment).isStarSlash = (bool)local_d0[1];
    (__return_storage_ptr__->fileComment).isDoxygenStyle = (bool)local_d0[2];
    (__return_storage_ptr__->fileComment).isReferringBackwards = (bool)local_d0[3];
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (__return_storage_ptr__->fileComment).lines.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (__return_storage_ptr__->fileComment).lines.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->fileComment).lines.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->fileComment).lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d0._8_8_;
    (__return_storage_ptr__->fileComment).lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_c0._M_allocated_capacity;
    (__return_storage_ptr__->fileComment).lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c0._8_8_;
    local_d0._8_8_ = (SourceCodeText *)0x0;
    local_c0._M_allocated_capacity = 0;
    local_c0._8_8_ = 0;
    local_d0._0_8_ = uVar3;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    pSVar2 = (__return_storage_ptr__->fileComment).range.start.sourceCode.object;
    if ((SourceCodeText *)local_b0.data != pSVar2) {
      (__return_storage_ptr__->fileComment).range.start.sourceCode.object =
           (SourceCodeText *)local_b0.data;
      local_b0.data = (char *)0x0;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
    }
    (__return_storage_ptr__->fileComment).range.start.location.data = local_a8.data;
    pSVar2 = (__return_storage_ptr__->fileComment).range.end.sourceCode.object;
    if (local_a0.object != pSVar2) {
      (__return_storage_ptr__->fileComment).range.end.sourceCode.object = local_a0.object;
      local_a0.object = (SourceCodeText *)0x0;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
    }
    (__return_storage_ptr__->fileComment).range.end.location.data = local_98.data;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.object);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_b0.data);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_d0 + 8));
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_88._0_8_);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError
            ("d.moduleKeyword.location.startsWith (d.getType().c_str())","createDecl",0x72);
}

Assistant:

SourceCodeOperations::ModuleDeclaration SourceCodeOperations::createDecl (AST::ModuleBase& m)
{
    ModuleDeclaration d { m, allocator };

    d.moduleKeyword = m.processorKeywordLocation;
    SOUL_ASSERT (d.moduleKeyword.location.startsWith (d.getType().c_str()));

    d.startIncludingPreamble = SourceCodeUtilities::findStartOfPrecedingComment (d.moduleKeyword);
    d.openBrace = SimpleTokeniser::findNext (d.moduleKeyword, Operator::openBrace);
    d.endOfClosingBrace = SourceCodeUtilities::findEndOfMatchingBrace (d.openBrace);
    d.fileComment = SourceCodeUtilities::parseComment (d.startIncludingPreamble);
    return d;
}